

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O2

void * luaZ_getaddr(ZIO *z,size_t n)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = checkbuffer(z);
  if ((iVar1 == 0) || (z->n < n)) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = z->p;
    z->n = z->n - n;
    z->p = pcVar2 + n;
  }
  return pcVar2;
}

Assistant:

const void *luaZ_getaddr (ZIO* z, size_t n) {
  const void *res;
  if (!checkbuffer(z))
    return NULL;  /* no more input */
  if (z->n < n)  /* not enough bytes? */
    return NULL;  /* block not whole; cannot give an address */
  res = z->p;  /* get block address */
  z->n -= n;  /* consume these bytes */
  z->p += n;
  return res;
}